

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O3

void __thiscall
yy::parser::value_type::move<ArrayAccessExpression*>(value_type *this,self_type *that)

{
  ArrayAccessExpression **ppAVar1;
  
  ppAVar1 = as<ArrayAccessExpression*>(that);
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&ArrayAccessExpression*::typeinfo;
    *(ArrayAccessExpression **)&this->field_0 = *ppAVar1;
    as<ArrayAccessExpression*>(that);
    that->yytypeid_ = (type_info *)0x0;
    return;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wh4tsername[P]Mini-Java-Compiler/compiler/parser.hh"
                ,0x104,
                "T &yy::parser::value_type::emplace(U &&...) [T = ArrayAccessExpression *, U = <ArrayAccessExpression *>]"
               );
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }